

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_query_decoder.c
# Opt level: O0

int pt_qry_event(pt_query_decoder *decoder,pt_event *uev,size_t size)

{
  int iVar1;
  int status;
  int errcode;
  pt_event *ev;
  size_t size_local;
  pt_event *uev_local;
  pt_query_decoder *decoder_local;
  
  if ((decoder == (pt_query_decoder *)0x0) || (uev == (pt_event *)0x0)) {
    decoder_local._4_4_ = -2;
  }
  else if (size < 0x28) {
    decoder_local._4_4_ = -2;
  }
  else {
    iVar1 = pt_tnt_cache_is_empty(&decoder->tnt);
    if (iVar1 == 0) {
      decoder_local._4_4_ = -8;
    }
    else {
      decoder_local._4_4_ = decoder->status;
      if (-1 < decoder_local._4_4_) {
        decoder_local._4_4_ = pt_qry_event_pending(&decoder->event);
        if (decoder_local._4_4_ < 1) {
          if (-1 < decoder_local._4_4_) {
            decoder_local._4_4_ = -8;
          }
        }
        else {
          ev = (pt_event *)size;
          if (0x48 < size) {
            ev = (pt_event *)0x48;
          }
          memcpy(uev,&decoder->event,(size_t)ev);
          memcpy(&decoder->last_time,&(decoder->evdec).time,0x30);
          decoder_local._4_4_ = pt_qry_fetch_event(decoder);
          if (-1 < decoder_local._4_4_) {
            decoder_local._4_4_ = pt_qry_status_flags(decoder);
          }
        }
      }
    }
  }
  return decoder_local._4_4_;
}

Assistant:

int pt_qry_event(struct pt_query_decoder *decoder, struct pt_event *uev,
		 size_t size)
{
	const struct pt_event *ev;
	int errcode, status;

	if (!decoder || !uev)
		return -pte_invalid;

	if (size < offsetof(struct pt_event, variant))
		return -pte_invalid;

	/* We do not allow querying for events while there are still TNT
	 * bits to consume.
	 */
	if (!pt_tnt_cache_is_empty(&decoder->tnt))
		return -pte_bad_query;

	/* Report any deferred error. */
	errcode = decoder->status;
	if (errcode < 0)
		return errcode;

	ev = &decoder->event;

	status = pt_qry_event_pending(ev);
	if (status <= 0) {
		if (status < 0)
			return status;

		return -pte_bad_query;
	}

	/* Copy the event to the user.  Make sure we're not writing beyond the
	 * memory provided by the user.
	 *
	 * We might truncate details of an event but only for those events the
	 * user can't know about, anyway.
	 */
	if (sizeof(*uev) < size)
		size = sizeof(*uev);

	memcpy(uev, ev, size);

	/* Preserve the time at the event. */
	decoder->last_time = decoder->evdec.time;

	errcode = pt_qry_fetch_event(decoder);
	if (errcode < 0)
		return errcode;

	return pt_qry_status_flags(decoder);
}